

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyRandomnessInit(SyPRNGCtx *pCtx,ProcRandomSeed xSeed,void *pUserData)

{
  uchar *puVar1;
  sxi32 in_EAX;
  int __fd;
  ssize_t sVar2;
  long lVar3;
  byte bVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  pid_t pid;
  char zSeed [256];
  __pid_t local_11c;
  char local_118 [4];
  timeval local_114 [15];
  
  if (pCtx->nMagic == 0x13c4) {
    return in_EAX;
  }
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    sVar2 = read(__fd,local_118,0x100);
    close(__fd);
    if (0 < sVar2) goto LAB_0011565f;
  }
  local_11c = getpid();
  SyMemcpy(&local_11c,local_118,4);
  gettimeofday((timeval *)(local_118 + 4),(__timezone_ptr_t)0x0);
LAB_0011565f:
  pCtx->i = '\0';
  uVar5 = '\0';
  uVar6 = '\x01';
  uVar7 = '\x02';
  uVar8 = '\x03';
  uVar9 = '\x04';
  uVar10 = '\x05';
  uVar11 = '\x06';
  uVar12 = '\a';
  uVar13 = '\b';
  uVar14 = '\t';
  uVar15 = '\n';
  uVar16 = '\v';
  uVar17 = '\f';
  uVar18 = '\r';
  uVar19 = '\x0e';
  uVar20 = '\x0f';
  lVar3 = 0;
  do {
    puVar1 = pCtx->s + lVar3;
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    puVar1[4] = uVar9;
    puVar1[5] = uVar10;
    puVar1[6] = uVar11;
    puVar1[7] = uVar12;
    puVar1[8] = uVar13;
    puVar1[9] = uVar14;
    puVar1[10] = uVar15;
    puVar1[0xb] = uVar16;
    puVar1[0xc] = uVar17;
    puVar1[0xd] = uVar18;
    puVar1[0xe] = uVar19;
    puVar1[0xf] = uVar20;
    lVar3 = lVar3 + 0x10;
    uVar5 = uVar5 + '\x10';
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
  } while (lVar3 != 0x100);
  lVar3 = 0;
  bVar4 = 0;
  do {
    bVar4 = bVar4 + local_118[lVar3] + pCtx->s[lVar3];
    uVar5 = pCtx->s[bVar4];
    pCtx->s[bVar4] = pCtx->s[lVar3];
    pCtx->s[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  pCtx->j = bVar4;
  pCtx->nMagic = 0x13c4;
  return 0x100;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomnessInit(SyPRNGCtx *pCtx, ProcRandomSeed xSeed, void * pUserData)
{
	char zSeed[256];
	sxu8 t;
	sxi32 rc;
	sxu32 i;
	if( pCtx->nMagic == SXPRNG_MAGIC ){
		return SXRET_OK; /* Already initialized */
	}
 /* Initialize the state of the random number generator once, 
  ** the first time this routine is called.The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  */	
	if( xSeed == 0 ){
		xSeed = SyOSUtilRandomSeed;
	}
	rc = xSeed(zSeed, sizeof(zSeed), pUserData);
	if( rc != SXRET_OK ){
		return rc;
	}
	pCtx->i = pCtx->j = 0;
	for(i=0; i < SX_ARRAYSIZE(pCtx->s) ; i++){
		pCtx->s[i] = (unsigned char)i;
    }
    for(i=0; i < sizeof(zSeed) ; i++){
      pCtx->j += pCtx->s[i] + zSeed[i];
      t = pCtx->s[pCtx->j];
      pCtx->s[pCtx->j] = pCtx->s[i];
      pCtx->s[i] = t;
    }
	pCtx->nMagic = SXPRNG_MAGIC;
	
	return SXRET_OK;
}